

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

void CBlockFileInfo::SerializationOps<DataStream,CBlockFileInfo_const,ActionSerialize>
               (unsigned_long *obj,DataStream *s)

{
  long in_FS_OFFSET;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_long_&> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_object = obj;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)&local_28,s);
  local_28.m_object = obj + 4;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)&local_28,s);
  local_28.m_object = obj + 1;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)&local_28,s);
  local_28.m_object = obj + 0xc;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)&local_28,s);
  local_28.m_object = obj + 2;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)&local_28,s);
  local_28.m_object = obj + 3;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_long_&>::Serialize<DataStream>(&local_28,s)
  ;
  local_28.m_object = obj + 4;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_long_&>::Serialize<DataStream>(&local_28,s)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CBlockFileInfo, obj)
    {
        READWRITE(VARINT(obj.nBlocks));
        READWRITE(VARINT(obj.nSize));
        READWRITE(VARINT(obj.nUndoSize));
        READWRITE(VARINT(obj.nHeightFirst));
        READWRITE(VARINT(obj.nHeightLast));
        READWRITE(VARINT(obj.nTimeFirst));
        READWRITE(VARINT(obj.nTimeLast));
    }